

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O1

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,void *data,PT size)

{
  PT PVar1;
  bool bVar2;
  Buffer *pBVar3;
  Buffer *pBVar4;
  ulong uVar5;
  ulong __n;
  PT PVar6;
  ulong uVar7;
  
  if (size != 0) {
    if (this->beg == (Buffer *)0x0) {
      PVar6 = 0x7e4;
      if (0x7e4 < size) {
        PVar6 = size;
      }
      uVar7 = PVar6 + 7 & 0xfffffffffffffff8;
      pBVar4 = (Buffer *)malloc(uVar7 + 0x1c);
      pBVar4->used = 0;
      pBVar4->size = uVar7;
      pBVar4->next = (Buffer *)0x0;
      pBVar4->cpt_use = 0;
      this->beg = pBVar4;
      this->end = pBVar4;
      this->off = 0;
    }
    else {
      pBVar4 = this->end;
      __n = pBVar4->size - pBVar4->used;
      uVar7 = size - __n;
      if (size < __n || uVar7 == 0) {
        memcpy(pBVar4->data + pBVar4->used,data,size);
        this->end->used = this->end->used + size;
        uVar7 = size;
      }
      else {
        memcpy(pBVar4->data + pBVar4->used,data,__n);
        data = (void *)((long)data + __n);
        pBVar4 = this->end;
        uVar5 = 0x7e4;
        if (0x7e4 < uVar7) {
          uVar5 = uVar7;
        }
        pBVar4->used = pBVar4->size;
        uVar5 = uVar5 + 7 & 0xfffffffffffffff8;
        pBVar3 = (Buffer *)malloc(uVar5 + 0x1c);
        pBVar3->used = 0;
        pBVar3->size = uVar5;
        pBVar3->next = (Buffer *)0x0;
        pBVar3->cpt_use = 0;
        pBVar4->next = pBVar3;
        this->end = pBVar3;
      }
      bVar2 = size <= __n;
      size = uVar7;
      if (bVar2) {
        return;
      }
    }
    pBVar4 = this->end;
    uVar7 = pBVar4->size;
    if (uVar7 < size) {
      do {
        memcpy(pBVar4->data,data,uVar7);
        pBVar3 = this->end;
        PVar1 = pBVar3->size;
        data = (void *)((long)data + PVar1);
        pBVar3->used = PVar1;
        size = size - PVar1;
        pBVar4 = (Buffer *)malloc(0x804);
        pBVar4->used = 0;
        pBVar4->size = 0x7e8;
        pBVar4->next = (Buffer *)0x0;
        pBVar4->cpt_use = 0;
        pBVar3->next = pBVar4;
        this->end = pBVar4;
        uVar7 = pBVar4->size;
      } while (uVar7 < size);
    }
    memcpy(pBVar4->data,data,size);
    this->end->used = size;
  }
  return;
}

Assistant:

void CbQueue::write_some( const void *data, PT size ) {
    if ( not size )
        return;

    if ( beg ) {
        PT room = end->room();
        if ( size <= room ) {
            memcpy( end->data + end->used, data, size );
            end->used += size;
            return;
        }
        // -> size > room, buffer with used that may be != 0
        memcpy( end->data + end->used, data, room ); data = reinterpret_cast<const PI8 *>( data ) + room;
        end->used = end->size;
        size -= room;

        end = Buffer::New( std::max( PT( Buffer::default_size ), size ), end );
    } else {
        beg = Buffer::New( std::max( PT( Buffer::default_size ), size ) );
        end = beg;
        off = 0;
    }

    // -> size != 0, buffers with used == 0
    while ( size > end->size ) {
        memcpy( end->data, data, end->size ); data = reinterpret_cast<const PI8 *>( data ) + end->size;
        end->used = end->size;
        size -= end->size;

        end = Buffer::New( Buffer::default_size, end );
    }

    // -> buffer with used == 0, size < Buffer::size
    memcpy( end->data, data, size );
    end->used = size;
}